

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void SetRow_X86(uint8_t *dst,uint8_t v8,int width)

{
  long lVar1;
  uint32_t v32;
  size_t width_tmp;
  int width_local;
  uint8_t v8_local;
  uint8_t *dst_local;
  
  for (lVar1 = (long)(width >> 2); lVar1 != 0; lVar1 = lVar1 + -1) {
    *(uint *)dst = (uint)v8 * 0x1010101;
    dst = (uint8_t *)((long)dst + 4);
  }
  return;
}

Assistant:

void SetRow_X86(uint8_t* dst, uint8_t v8, int width) {
  size_t width_tmp = (size_t)(width >> 2);
  const uint32_t v32 = v8 * 0x01010101u;  // Duplicate byte to all bytes.
  asm volatile(

      "rep         stosl                         \n"
      : "+D"(dst),       // %0
        "+c"(width_tmp)  // %1
      : "a"(v32)         // %2
      : "memory", "cc");
}